

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O1

string * CLI::detail::binary_escape_string(string *__return_storage_ptr__,string *string_to_escape)

{
  byte __c;
  size_type sVar1;
  pointer pcVar2;
  size_t __n;
  int iVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  void *pvVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  char *__s;
  ulong uVar8;
  size_type __size;
  size_type sVar9;
  string code;
  stringstream stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  size_type *local_218;
  size_type local_210;
  size_type local_208;
  undefined8 uStack_200;
  long *local_1f8;
  ulong local_1f0;
  long local_1e8 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d8;
  stringstream local_1b8 [16];
  long local_1a8 [3];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  sVar1 = string_to_escape->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (string_to_escape->_M_dataplus)._M_p;
    sVar9 = 0;
    do {
      __c = pcVar2[sVar9];
      iVar3 = isprint((uint)__c);
      if (iVar3 == 0) {
        ::std::__cxx11::stringstream::stringstream(local_1b8);
        *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) =
             *(uint *)((long)auStack_190 + *(long *)(local_1a8[0] + -0x18)) & 0xffffffb5 | 8;
        ::std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        ::std::__cxx11::stringbuf::str();
        local_1d8._M_dataplus._M_p = (pointer)&local_1d8.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,"\\x","");
        __s = "";
        if (local_1f0 < 2) {
          __s = "0";
        }
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_1d8,__s);
        local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar4->_M_dataplus)._M_p;
        paVar6 = &pbVar4->field_2;
        if (paVar7 == paVar6) {
          local_238.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_238.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
        }
        else {
          local_238.field_2._M_allocated_capacity = paVar6->_M_allocated_capacity;
          local_238._M_dataplus._M_p = (pointer)paVar7;
        }
        local_238._M_string_length = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar6;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 _M_append(&local_238,(char *)local_1f8,local_1f0);
        local_218 = (size_type *)(pbVar4->_M_dataplus)._M_p;
        paVar7 = &pbVar4->field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_218 == paVar7) {
          local_208 = paVar7->_M_allocated_capacity;
          uStack_200 = *(undefined8 *)((long)&pbVar4->field_2 + 8);
          local_218 = &local_208;
        }
        else {
          local_208 = paVar7->_M_allocated_capacity;
        }
        local_210 = pbVar4->_M_string_length;
        (pbVar4->_M_dataplus)._M_p = (pointer)paVar7;
        pbVar4->_M_string_length = 0;
        (pbVar4->field_2)._M_local_buf[0] = '\0';
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (__return_storage_ptr__,(char *)local_218,local_210);
        if (local_218 != &local_208) {
          operator_delete(local_218,local_208 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != &local_238.field_2) {
          operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
          operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
        }
        if (local_1f8 != local_1e8) {
          operator_delete(local_1f8,local_1e8[0] + 1);
        }
        ::std::__cxx11::stringstream::~stringstream(local_1b8);
        ::std::ios_base::~ios_base(local_138);
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
                  (__return_storage_ptr__,__c);
      }
      sVar9 = sVar9 + 1;
    } while (sVar1 != sVar9);
  }
  __n = __return_storage_ptr__->_M_string_length;
  if ((__n != string_to_escape->_M_string_length) ||
     ((__n != 0 &&
      (iVar3 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,(string_to_escape->_M_dataplus)._M_p,
                    __n), iVar3 != 0)))) {
    if (__n == 0) {
      uVar8 = 0xffffffffffffffff;
    }
    else {
      pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
      pvVar5 = memchr(pcVar2,0x27,__n);
      uVar8 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar2;
    }
    while (uVar8 != 0xffffffffffffffff) {
      (__return_storage_ptr__->_M_dataplus)._M_p[uVar8] = '\\';
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
                (__return_storage_ptr__,uVar8 + 1,0,"x27",3);
      if (__return_storage_ptr__->_M_string_length == 0) {
        uVar8 = 0xffffffffffffffff;
      }
      else {
        pcVar2 = (__return_storage_ptr__->_M_dataplus)._M_p;
        pvVar5 = memchr(pcVar2,0x27,__return_storage_ptr__->_M_string_length);
        uVar8 = -(ulong)(pvVar5 == (void *)0x0) | (long)pvVar5 - (long)pcVar2;
      }
    }
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::replace
              (__return_storage_ptr__,0,0,"\'B\"(",4);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,')');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'\"');
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'\'');
  }
  return __return_storage_ptr__;
}

Assistant:

CLI11_INLINE std::string binary_escape_string(const std::string &string_to_escape) {
    // s is our escaped output string
    std::string escaped_string{};
    // loop through all characters
    for(char c : string_to_escape) {
        // check if a given character is printable
        // the cast is necessary to avoid undefined behaviour
        if(isprint(static_cast<unsigned char>(c)) == 0) {
            std::stringstream stream;
            // if the character is not printable
            // we'll convert it to a hex string using a stringstream
            // note that since char is signed we have to cast it to unsigned first
            stream << std::hex << static_cast<unsigned int>(static_cast<unsigned char>(c));
            std::string code = stream.str();
            escaped_string += std::string("\\x") + (code.size() < 2 ? "0" : "") + code;

        } else {
            escaped_string.push_back(c);
        }
    }
    if(escaped_string != string_to_escape) {
        auto sqLoc = escaped_string.find('\'');
        while(sqLoc != std::string::npos) {
            escaped_string[sqLoc] = '\\';
            escaped_string.insert(sqLoc + 1, "x27");
            sqLoc = escaped_string.find('\'');
        }
        escaped_string.insert(0, "'B\"(");
        escaped_string.push_back(')');
        escaped_string.push_back('"');
        escaped_string.push_back('\'');
    }
    return escaped_string;
}